

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc.c++
# Opt level: O0

VoidPromiseAndPipeline * __thiscall
capnp::_::anon_unknown_0::RpcConnectionState::startCall
          (VoidPromiseAndPipeline *__return_storage_ptr__,RpcConnectionState *this,
          uint64_t interfaceId,uint64_t methodId,Own<capnp::ClientHook> *capability,
          Own<capnp::CallContextHook> *context)

{
  Reader value;
  undefined8 this_00;
  int iVar1;
  uint uVar2;
  Type *func;
  ClientHook *pCVar3;
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *other;
  Promise<kj::Own<capnp::ClientHook>_> *pPVar4;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:2393:15),_kj::Own<capnp::CallContextHook>_>
  *func_00;
  TypeByIndex<0UL,_kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_> *t;
  Promise<void> *pPVar5;
  TypeByIndex<1UL,_kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_> *t_00;
  Promise<kj::Own<capnp::PipelineHook>_> *promise;
  undefined4 extraout_var;
  RefOrVoid<capnp::ClientHook> from;
  RpcClient *this_01;
  Own<capnp::CallContextHook> *pOVar6;
  CallContextHook *pCVar7;
  Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
  *request_00;
  MessageSize MVar8;
  Own<capnp::RequestHook> local_238;
  SegmentReader *local_228;
  SegmentReader *pSStack_220;
  CapTableReader *local_218;
  void *pvStack_210;
  WirePointer *local_208;
  StructDataBitCount SStack_200;
  StructPointerCount SStack_1fc;
  undefined2 uStack_1fa;
  Own<capnp::ClientHook> local_1f8;
  Client local_1e8;
  Maybe<capnp::MessageSize> local_1d0;
  undefined1 local_1b8 [8];
  Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
  request;
  MessageSize requestSize;
  undefined1 auStack_150 [8];
  ReaderFor<capnp::Persistent<>::SaveParams> params;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> local_118;
  Own<capnp::CallContextHook> local_100;
  uint64_t local_f0;
  CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:2393:15),_kj::Own<capnp::CallContextHook>_>
  local_e8;
  Own<capnp::_::(anonymous_namespace)::RpcConnectionState> local_c0;
  Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> local_b0;
  undefined1 local_a0 [8];
  SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> promises;
  Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_> local_70;
  undefined1 local_58 [8];
  NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> resolvedPromise;
  Client *g;
  Own<capnp::CallContextHook> *context_local;
  Own<capnp::ClientHook> *capability_local;
  uint64_t methodId_local;
  uint64_t interfaceId_local;
  RpcConnectionState *this_local;
  
  func = (Type *)typeId<capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>,capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>::_capnpPrivate>
                           ();
  if (((Type *)interfaceId == func) && (methodId == 0)) {
    resolvedPromise.field_1.value.super_PromiseBase.node.ptr =
         (PromiseNode *)
         kj::_::
         readMaybe<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::Client>
                   (&this->gateway);
    if ((Client *)resolvedPromise.field_1.value.super_PromiseBase.node.ptr != (Client *)0x0) {
      pCVar3 = kj::Own<capnp::ClientHook>::operator->(capability);
      (*pCVar3->_vptr_ClientHook[3])();
      other = kj::_::readMaybe<kj::Promise<kj::Own<capnp::ClientHook>>>(&local_70);
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::NullableValue
                ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_58,other);
      kj::Maybe<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~Maybe(&local_70);
      pPVar4 = kj::_::NullableValue::operator_cast_to_Promise_((NullableValue *)local_58);
      if (pPVar4 == (Promise<kj::Own<capnp::ClientHook>_> *)0x0) {
        params._reader._44_4_ = 0;
      }
      else {
        func_00 = (CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_c__:2393:15),_kj::Own<capnp::CallContextHook>_>
                   *)kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::operator->
                               ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_58
                               );
        local_100.disposer = (Disposer *)this;
        local_100.ptr = (CallContextHook *)interfaceId;
        local_f0 = methodId;
        kj::
        mvCapture<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)_1_,kj::Own<capnp::CallContextHook>&>
                  (&local_e8,(kj *)context,&local_100,func);
        kj::Promise<kj::Own<capnp::ClientHook>>::
        then<kj::CaptureByMove<capnp::_::(anonymous_namespace)::RpcConnectionState::startCall(unsigned_long,unsigned_long,kj::Own<capnp::ClientHook>&&,kj::Own<capnp::CallContextHook>&&)::_lambda(kj::Own<capnp::CallContextHook>&&,kj::Own<capnp::ClientHook>)_1_,kj::Own<capnp::CallContextHook>>,kj::_::PropagateException>
                  ((Promise<kj::Own<capnp::ClientHook>> *)&local_c0,func_00,
                   (PropagateException *)&local_e8);
        kj::addRef<capnp::_::(anonymous_namespace)::RpcConnectionState>((kj *)&local_118,this);
        kj::mv<kj::Own<capnp::ClientHook>>(capability);
        kj::Promise<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>>::
        attach<kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>,kj::Own<capnp::ClientHook>>
                  ((Promise<kj::_::Tuple<kj::Promise<void>,kj::Own<capnp::PipelineHook>>> *)
                   &local_b0,&local_c0,(Own<capnp::ClientHook> *)&local_118);
        kj::Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>::split
                  ((SplitTuplePromise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>
                    *)local_a0,&local_b0);
        kj::Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>::~Promise
                  (&local_b0);
        kj::Own<capnp::_::(anonymous_namespace)::RpcConnectionState>::~Own(&local_118);
        kj::Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_>::~Promise
                  ((Promise<kj::_::Tuple<kj::Promise<void>,_kj::Own<capnp::PipelineHook>_>_> *)
                   &local_c0);
        kj::
        CaptureByMove<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc.c++:2393:15),_kj::Own<capnp::CallContextHook>_>
        ::~CaptureByMove(&local_e8);
        t = kj::get<0ul,kj::_::Tuple<kj::Promise<void>,kj::Promise<kj::Own<capnp::PipelineHook>>>&>
                      ((Tuple<kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_> *)
                       local_a0);
        pPVar5 = kj::mv<kj::Promise<void>>(t);
        kj::Promise<void>::Promise(&__return_storage_ptr__->promise,pPVar5);
        t_00 = kj::
               get<1ul,kj::_::Tuple<kj::Promise<void>,kj::Promise<kj::Own<capnp::PipelineHook>>>&>
                         ((Tuple<kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_> *)
                          local_a0);
        promise = kj::mv<kj::Promise<kj::Own<capnp::PipelineHook>>>(t_00);
        newLocalPromisePipeline((capnp *)&__return_storage_ptr__->pipeline,promise);
        params._reader._44_4_ = 1;
        kj::_::Tuple<kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_>::~Tuple
                  ((Tuple<kj::Promise<void>,_kj::Promise<kj::Own<capnp::PipelineHook>_>_> *)local_a0
                  );
      }
      kj::_::NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_>::~NullableValue
                ((NullableValue<kj::Promise<kj::Own<capnp::ClientHook>_>_> *)local_58);
      if (params._reader._44_4_ != 0) {
        return __return_storage_ptr__;
      }
      pCVar3 = kj::Own<capnp::ClientHook>::operator->(capability);
      iVar1 = (*pCVar3->_vptr_ClientHook[5])();
      if ((RpcConnectionState *)CONCAT44(extraout_var,iVar1) == this) {
        from = kj::Own<capnp::ClientHook>::operator*(capability);
        this_01 = kj::
                  downcast<capnp::_::(anonymous_namespace)::RpcConnectionState::RpcClient,capnp::ClientHook>
                            (from);
        pOVar6 = kj::mv<kj::Own<capnp::CallContextHook>>(context);
        RpcClient::callNoIntercept
                  (__return_storage_ptr__,this_01,interfaceId,(uint16_t)methodId,pOVar6);
        return __return_storage_ptr__;
      }
      pCVar7 = kj::Own<capnp::CallContextHook>::operator->(context);
      (**pCVar7->_vptr_CallContextHook)();
      AnyPointer::Reader::getAs<capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>::SaveParams>
                ((ReaderFor<capnp::Persistent<>::SaveParams> *)auStack_150,
                 (Reader *)&requestSize.capCount);
      MVar8 = Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveParams::Reader::totalSize
                        ((ReaderFor<capnp::Persistent<>::SaveParams> *)auStack_150);
      request.hook.ptr = (RequestHook *)MVar8.wordCount;
      requestSize.wordCount._0_4_ = MVar8.capCount + 1;
      uVar2 = sizeInWords<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::ExportParams>
                        ();
      this_00 = resolvedPromise.field_1.value.super_PromiseBase.node.ptr;
      request.hook.ptr =
           (RequestHook *)((long)&(request.hook.ptr)->_vptr_RequestHook + (ulong)uVar2);
      kj::Maybe<capnp::MessageSize>::Maybe(&local_1d0,(MessageSize *)&request.hook.ptr);
      RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::
      Client::exportRequest
                ((Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
                  *)local_1b8,(Client *)this_00,&local_1d0);
      kj::Maybe<capnp::MessageSize>::~Maybe(&local_1d0);
      pCVar3 = kj::Own<capnp::ClientHook>::operator->(capability);
      (*pCVar3->_vptr_ClientHook[4])(&local_1f8);
      Persistent<capnp::AnyPointer,_capnp::AnyPointer>::Client::Client(&local_1e8,&local_1f8);
      RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::
      ExportParams::Builder::setCap((Builder *)local_1b8,&local_1e8);
      Persistent<capnp::AnyPointer,_capnp::AnyPointer>::Client::~Client(&local_1e8);
      kj::Own<capnp::ClientHook>::~Own(&local_1f8);
      local_208 = params._reader.pointers;
      SStack_200 = params._reader.dataSize;
      SStack_1fc = params._reader.pointerCount;
      uStack_1fa = params._reader._38_2_;
      local_218 = params._reader.capTable;
      pvStack_210 = params._reader.data;
      local_228 = (SegmentReader *)auStack_150;
      pSStack_220 = params._reader.segment;
      value._reader.capTable = (CapTableReader *)params._reader.segment;
      value._reader.segment = (SegmentReader *)auStack_150;
      value._reader.data = params._reader.capTable;
      value._reader.pointers = (WirePointer *)params._reader.data;
      value._reader._32_8_ = params._reader.pointers;
      value._reader.nestingLimit = params._reader.dataSize;
      value._reader._44_2_ = params._reader.pointerCount;
      value._reader._46_2_ = params._reader._38_2_;
      RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::
      ExportParams::Builder::setParams((Builder *)local_1b8,value);
      pCVar7 = kj::Own<capnp::CallContextHook>::operator->(context);
      (*pCVar7->_vptr_CallContextHook[4])();
      pCVar7 = kj::Own<capnp::CallContextHook>::operator->(context);
      (*pCVar7->_vptr_CallContextHook[1])();
      pCVar7 = kj::Own<capnp::CallContextHook>::operator->(context);
      request_00 = kj::
                   mv<capnp::Request<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>::SaveResults>>
                             ((Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
                               *)local_1b8);
      RequestHook::
      from<capnp::RealmGateway<capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer,capnp::AnyPointer>::ExportParams,capnp::Persistent<capnp::AnyPointer,capnp::AnyPointer>::SaveResults>
                ((RequestHook *)&local_238,request_00);
      (*pCVar7->_vptr_CallContextHook[6])(__return_storage_ptr__,pCVar7,&local_238);
      kj::Own<capnp::RequestHook>::~Own(&local_238);
      params._reader._44_4_ = 1;
      Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
      ::~Request((Request<capnp::RealmGateway<capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer,_capnp::AnyPointer>::ExportParams,_capnp::Persistent<capnp::AnyPointer,_capnp::AnyPointer>::SaveResults>
                  *)local_1b8);
      return __return_storage_ptr__;
    }
    resolvedPromise.field_1.value.super_PromiseBase.node.ptr = (PromiseNode *)0x0;
  }
  pCVar3 = kj::Own<capnp::ClientHook>::operator->(capability);
  pOVar6 = kj::mv<kj::Own<capnp::CallContextHook>>(context);
  (*pCVar3->_vptr_ClientHook[1])(__return_storage_ptr__,pCVar3,interfaceId,methodId & 0xffff,pOVar6)
  ;
  return __return_storage_ptr__;
}

Assistant:

ClientHook::VoidPromiseAndPipeline startCall(
      uint64_t interfaceId, uint64_t methodId,
      kj::Own<ClientHook>&& capability, kj::Own<CallContextHook>&& context) {
    if (interfaceId == typeId<Persistent<>>() && methodId == 0) {
      KJ_IF_MAYBE(g, gateway) {
        // Wait, this is a call to Persistent.save() and we need to translate it through our
        // gateway.

        KJ_IF_MAYBE(resolvedPromise, capability->whenMoreResolved()) {
          // The plot thickens: We're looking at a promise capability. It could end up resolving
          // to a capability outside the gateway, in which case we don't want to translate at all.

          auto promises = resolvedPromise->then(kj::mvCapture(context,
              [this,interfaceId,methodId](kj::Own<CallContextHook>&& context,
                                          kj::Own<ClientHook> resolvedCap) {
            auto vpap = startCall(interfaceId, methodId, kj::mv(resolvedCap), kj::mv(context));
            return kj::tuple(kj::mv(vpap.promise), kj::mv(vpap.pipeline));
          })).attach(addRef(*this), kj::mv(capability)).split();

          return {
            kj::mv(kj::get<0>(promises)),
            newLocalPromisePipeline(kj::mv(kj::get<1>(promises))),
          };
        }

        if (capability->getBrand() == this) {
          // This capability is one of our own, pointing back out over the network. That means
          // that it would be inappropriate to apply the gateway transformation. We just want to
          // reflect the call back.
          return kj::downcast<RpcClient>(*capability)
              .callNoIntercept(interfaceId, methodId, kj::mv(context));
        }

        auto params = context->getParams().getAs<Persistent<>::SaveParams>();

        auto requestSize = params.totalSize();
        ++requestSize.capCount;
        requestSize.wordCount += sizeInWords<RealmGateway<>::ExportParams>();

        auto request = g->exportRequest(requestSize);
        request.setCap(Persistent<>::Client(capability->addRef()));
        request.setParams(params);

        context->allowCancellation();
        context->releaseParams();
        return context->directTailCall(RequestHook::from(kj::mv(request)));
      }
    }

    return capability->call(interfaceId, methodId, kj::mv(context));
  }